

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext *ctx,ExprVariableAccess *node)

{
  LLVMValueRefOpaque **ppLVar1;
  LLVMValueRef pLVar2;
  
  ppLVar1 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
            find(&ctx->variables,&node->variable->uniqueId);
  if (ppLVar1 != (LLVMValueRefOpaque **)0x0) {
    CreateLlvmName(ctx,node->variable->name->name);
    pLVar2 = ConvertToStackType(ctx,(LLVMValueRef)&placeholderValue,node->variable->type);
    pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
    return pLVar2;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x668,
                "LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext &, ExprVariableAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext &ctx, ExprVariableAccess *node)
{
	LLVMValueRef *value = ctx.variables.find(node->variable->uniqueId);

	assert(value);

	return CheckType(ctx, node, ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, *value, CreateLlvmName(ctx, node->variable->name->name)), node->variable->type));
}